

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberAccess.h
# Opt level: O1

ptr<Value> __thiscall MemberAccess::evaluate(MemberAccess *this,Environment *env)

{
  size_type sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  long lVar7;
  undefined4 *puVar8;
  Identifier *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ptr<Value> pVar10;
  ptr<Object> object;
  ptr<Value> currValue;
  string local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Identifier *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  __buckets_ptr local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  sVar1 = (env->symbols)._M_h._M_bucket_count;
  if (sVar1 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = __dynamic_cast(sVar1,&Expression::typeinfo,&Symbol::typeinfo,0);
  }
  if (lVar6 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar6 = 0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (env->symbols)._M_h._M_before_begin._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  sVar1 = (env->symbols)._M_h._M_element_count;
  if (sVar1 == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = __dynamic_cast(sVar1,&Expression::typeinfo,&Symbol::typeinfo,0);
  }
  if (lVar7 == 0) {
    lVar7 = 0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               &(env->symbols)._M_h._M_rehash_policy;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  if ((lVar6 != 0) && (lVar7 != 0)) {
    pVar10 = Environment::getValue((Environment *)&local_40,in_RDX);
    (*(code *)(*local_40)[6]._M_nxt)
              (&local_50,local_40,
               pVar10.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._M_pi)
    ;
    pVar10 = Object::getAttribute((Object *)this,local_50);
    _Var9 = pVar10.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((this->super_BinaryOperator).super_Expression._vptr_Expression != (_func_int **)0x0) {
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        _Var9._M_pi = extraout_RDX;
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        _Var9._M_pi = extraout_RDX_00;
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        _Var9._M_pi = extraout_RDX_01;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var9._M_pi = extraout_RDX_02;
      }
      pVar10.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi;
      pVar10.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (ptr<Value>)pVar10.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
    }
    puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Member not defined","");
    ExceptionObjects::undefined((ExceptionObjects *)&local_78,&local_98);
    uVar2 = (undefined4)local_78;
    uVar3 = local_78._4_4_;
    uVar4 = (undefined4)uStack_70;
    uVar5 = uStack_70._4_4_;
    local_78 = 0;
    uStack_70 = 0;
    *puVar8 = uVar2;
    puVar8[1] = uVar3;
    puVar8[2] = uVar4;
    puVar8[3] = uVar5;
    __cxa_throw(puVar8,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"The identifier is not a symbol","");
  ExceptionObjects::undefined((ExceptionObjects *)&local_68,&local_98);
  uVar2 = (undefined4)local_68;
  uVar3 = local_68._4_4_;
  uVar4 = (undefined4)uStack_60;
  uVar5 = uStack_60._4_4_;
  local_68 = 0;
  uStack_60 = 0;
  *puVar8 = uVar2;
  puVar8[1] = uVar3;
  puVar8[2] = uVar4;
  puVar8[3] = uVar5;
  __cxa_throw(puVar8,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Symbol> symbolLeft = std::dynamic_pointer_cast<Symbol>(leftExpression);
        ptr<Symbol> symbolRight = std::dynamic_pointer_cast<Symbol>(rightExpression);

        if(!symbolLeft || !symbolRight)
            throw ThrowPacket(ExceptionObjects::undefined("The identifier is not a symbol"));

        ptr<Value> currValue = env -> getValue(symbolLeft -> name);
        ptr<Object> object = currValue -> asObject();
        ptr<Value> value = object -> getAttribute(symbolRight -> name);

        if(!value)
            throw ThrowPacket(ExceptionObjects::undefined("Member not defined"));

        return value;
    }